

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object>::setupSmallBuildRefBuilder
          (BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object> *this,size_t objectID,
          UserGeometry *param_2)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  undefined8 *puVar4;
  
  lVar1 = *(long *)(this + 0x10);
  lVar3 = *(long *)(lVar1 + objectID * 8);
  if ((lVar3 != 0) &&
     (lVar3 = __dynamic_cast(lVar3,&BVHNBuilderTwoLevel<8,embree::UserGeometry,embree::Object>::
                                    RefBuilderBase::typeinfo,
                             &BVHNBuilderTwoLevel<8,embree::UserGeometry,embree::Object>::
                              RefBuilderSmall::typeinfo,0), lVar3 != 0)) {
    return;
  }
  puVar4 = (undefined8 *)operator_new(0x10);
  *puVar4 = &PTR__RefBuilderBase_02219ce8;
  puVar4[1] = objectID;
  plVar2 = *(long **)(lVar1 + objectID * 8);
  *(undefined8 **)(lVar1 + objectID * 8) = puVar4;
  if (plVar2 == (long *)0x0) {
    return;
  }
  (**(code **)(*plVar2 + 8))();
  return;
}

Assistant:

void BVHNBuilderTwoLevel<N,Mesh,Primitive>::setupSmallBuildRefBuilder (size_t objectID, Mesh const * const /*mesh*/)
    {
      if (builders[objectID] == nullptr ||                                         // new mesh
          dynamic_cast<RefBuilderSmall*>(builders[objectID].get()) == nullptr)     // size change resulted in large->small change
      {
        builders[objectID].reset (new RefBuilderSmall(objectID));
      }
    }